

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O0

void alf_one_blk_chroma(pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef
                       ,int sample_bit_depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_9c;
  pel local_98;
  int local_94;
  int local_90;
  pel local_8c;
  int local_88;
  int xRight;
  int xLeft;
  int pixelIntV;
  int pixelIntU;
  int max_pel;
  int endPos;
  int startPos;
  int j;
  int i;
  pel *p6;
  pel *p5;
  pel *p4;
  pel *p3;
  pel *p2;
  pel *p1;
  int lcu_height_local;
  int lcu_width_local;
  int i_src_local;
  pel *src_local;
  pel *ppStack_10;
  int i_dst_local;
  pel *dst_local;
  
  iVar1 = (1 << ((byte)sample_bit_depth & 0x1f)) + -1;
  _lcu_width_local = src;
  ppStack_10 = dst;
  for (startPos = 0; startPos < lcu_height; startPos = startPos + 1) {
    p2 = _lcu_width_local + i_src;
    p3 = _lcu_width_local + -(long)i_src;
    p4 = _lcu_width_local + (i_src << 1);
    p5 = _lcu_width_local + -(long)(i_src << 1);
    p6 = _lcu_width_local + i_src * 3;
    _j = _lcu_width_local + -(long)(i_src * 3);
    if (startPos < 3) {
      if (startPos == 0) {
        p3 = _lcu_width_local;
        p5 = _lcu_width_local;
      }
      else if (startPos == 1) {
        p5 = p3;
      }
      _j = p5;
    }
    else if (lcu_height + -4 < startPos) {
      if (startPos == lcu_height + -1) {
        p2 = _lcu_width_local;
        p4 = _lcu_width_local;
      }
      else if (startPos == lcu_height + -2) {
        p4 = p2;
      }
      p6 = p4;
    }
    for (endPos = 0; SBORROW4(endPos,lcu_width * 2) != endPos + lcu_width * -2 < 0;
        endPos = endPos + 2) {
      iVar2 = endPos + -2;
      iVar3 = endPos + 2;
      local_90 = (int)(coef[0x10] * (uint)_lcu_width_local[endPos] +
                       coef[10] *
                       ((uint)_lcu_width_local[endPos + 6] + (uint)_lcu_width_local[endPos + -6]) +
                       coef[0xc] *
                       ((uint)_lcu_width_local[endPos + 4] + (uint)_lcu_width_local[endPos + -4]) +
                       coef[0xe] * ((uint)_lcu_width_local[iVar3] + (uint)_lcu_width_local[iVar2]) +
                       coef[8] * ((uint)p2[iVar2] + (uint)p3[iVar3]) +
                       coef[6] * ((uint)p2[endPos] + (uint)p3[endPos]) +
                       coef[4] * ((uint)p2[iVar3] + (uint)p3[iVar2]) +
                       coef[2] * ((uint)p4[endPos] + (uint)p5[endPos]) +
                       *coef * ((uint)p6[endPos] + (uint)_j[endPos]) + 0x20) >> 6;
      local_9c = (int)(coef[0x11] * (uint)_lcu_width_local[endPos + 1] +
                       coef[0xb] *
                       ((uint)_lcu_width_local[endPos + 7] + (uint)_lcu_width_local[endPos + -5]) +
                       coef[0xd] *
                       ((uint)_lcu_width_local[endPos + 5] + (uint)_lcu_width_local[endPos + -3]) +
                       coef[0xf] *
                       ((uint)_lcu_width_local[endPos + 3] + (uint)_lcu_width_local[endPos + -1]) +
                       coef[9] * ((uint)p2[endPos + -1] + (uint)p3[endPos + 3]) +
                       coef[7] * ((uint)p2[endPos + 1] + (uint)p3[endPos + 1]) +
                       coef[5] * ((uint)p2[endPos + 3] + (uint)p3[endPos + -1]) +
                       coef[3] * ((uint)p4[endPos + 1] + (uint)p5[endPos + 1]) +
                       coef[1] * ((uint)p6[endPos + 1] + (uint)_j[endPos + 1]) + 0x20) >> 6;
      local_88 = local_90;
      if (iVar1 < local_90) {
        local_88 = iVar1;
      }
      if (local_88 < 0) {
        local_8c = '\0';
      }
      else {
        if (iVar1 < local_90) {
          local_90 = iVar1;
        }
        local_8c = (pel)local_90;
      }
      ppStack_10[endPos] = local_8c;
      local_94 = local_9c;
      if (iVar1 < local_9c) {
        local_94 = iVar1;
      }
      if (local_94 < 0) {
        local_98 = '\0';
      }
      else {
        if (iVar1 < local_9c) {
          local_9c = iVar1;
        }
        local_98 = (pel)local_9c;
      }
      ppStack_10[endPos + 1] = local_98;
    }
    _lcu_width_local = _lcu_width_local + i_src;
    ppStack_10 = ppStack_10 + i_dst;
  }
  return;
}

Assistant:

static void alf_one_blk_chroma(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;
    int max_pel = (1 << sample_bit_depth) - 1;

    for (i = startPos; i < endPos; i++)
    {
        p1 = src + i_src;
        p2 = src - i_src;
        p3 = src + 2 * i_src;
        p4 = src - 2 * i_src;
        p5 = src + 3 * i_src;
        p6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                p4 = p2 = src;
            }
            else if (i == 1) {
                p4 = p2;
            }
            p6 = p4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                p3 = p1 = src;
            }
            else if (i == lcu_height - 2) {
                p3 = p1;
            }
            p5 = p3;
        }

        for (j = 0; j < lcu_width << 1; j += 2)
        {
            int pixelIntU, pixelIntV;
            int xLeft = j - 2;
            int xRight = j + 2;

            pixelIntU  = coef[0 ] * (p5[j         ] + p6[j]);
            pixelIntV  = coef[1 ] * (p5[j + 1     ] + p6[j + 1]);
            pixelIntU += coef[2 ] * (p3[j         ] + p4[j]);
            pixelIntV += coef[3 ] * (p3[j + 1     ] + p4[j + 1]);
            pixelIntU += coef[4 ] * (p1[xRight    ] + p2[xLeft]);
            pixelIntV += coef[5 ] * (p1[xRight + 1] + p2[xLeft + 1]);
            pixelIntU += coef[6 ] * (p1[j         ] + p2[j]);
            pixelIntV += coef[7 ] * (p1[j + 1     ] + p2[j + 1]);
            pixelIntU += coef[8 ] * (p1[xLeft     ] + p2[xRight]);
            pixelIntV += coef[9 ] * (p1[xLeft + 1 ] + p2[xRight + 1]);
            pixelIntU += coef[14] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[15] * (src [xRight + 1] + src [xLeft + 1]);

            xLeft  = j - 4;
            xRight = j + 4;
            pixelIntU += coef[12] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[13] * (src [xRight + 1] + src [xLeft + 1]);

            xLeft  = j - 6;
            xRight = j + 6;
            pixelIntU += coef[10] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[11] * (src [xRight + 1] + src [xLeft + 1]);

            pixelIntU += coef[16] * (src[j]);
            pixelIntV += coef[17] * (src[j + 1]);

            pixelIntU = (int)((pixelIntU + 32) >> 6);
            pixelIntV = (int)((pixelIntV + 32) >> 6);

            dst[j    ] = COM_CLIP3(0, max_pel, pixelIntU);
            dst[j + 1] = COM_CLIP3(0, max_pel, pixelIntV);

        }
        src += i_src;
        dst += i_dst;
    }
}